

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCore.c
# Opt level: O2

int Acec_MatchCountCommon(Vec_Wec_t *vLits1,Vec_Wec_t *vLits2,int Shift)

{
  int *piVar1;
  int *piVar2;
  Vec_Int_t *p;
  Vec_Int_t *pVVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  int iVar6;
  int iVar7;
  int i;
  int *piVar8;
  
  p = Vec_IntAlloc(100);
  i = 0;
  iVar7 = 0;
LAB_0053244f:
  if (vLits1->nSize <= i) {
    Vec_IntFree(p);
    return iVar7;
  }
  pVVar3 = Vec_WecEntry(vLits1,i);
  iVar6 = i + Shift;
  if ((-1 < iVar6) && (iVar6 < vLits2->nSize)) {
    pVVar4 = Vec_WecEntry(vLits2,iVar6);
    piVar8 = pVVar3->pArray;
    piVar5 = pVVar4->pArray;
    piVar1 = piVar8 + pVVar3->nSize;
    piVar2 = piVar5 + pVVar4->nSize;
    p->nSize = 0;
LAB_005324a1:
    do {
      if ((piVar1 <= piVar8) || (piVar2 <= piVar5)) goto LAB_005324cd;
      iVar6 = *piVar8;
      if (iVar6 == *piVar5) {
        Vec_IntPush(p,iVar6);
        piVar8 = piVar8 + 1;
      }
      else if (*piVar5 < iVar6) {
        piVar8 = piVar8 + 1;
        goto LAB_005324a1;
      }
      piVar5 = piVar5 + 1;
    } while( true );
  }
  goto LAB_005324e3;
LAB_005324cd:
  iVar7 = iVar7 + p->nSize;
LAB_005324e3:
  i = i + 1;
  goto LAB_0053244f;
}

Assistant:

int Acec_MatchCountCommon( Vec_Wec_t * vLits1, Vec_Wec_t * vLits2, int Shift )
{
    Vec_Int_t * vRes = Vec_IntAlloc( 100 );
    Vec_Int_t * vLevel1, * vLevel2; 
    int i, nCommon = 0;
    Vec_WecForEachLevel( vLits1, vLevel1, i )
    {
        if ( i+Shift < 0 || i+Shift >= Vec_WecSize(vLits2) )
            continue;
        vLevel2 = Vec_WecEntry( vLits2, i+Shift );
        nCommon += Vec_IntTwoFindCommonReverse( vLevel1, vLevel2, vRes );
    }
    Vec_IntFree( vRes );
    return nCommon;
}